

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O0

bool __thiscall bssl::TemporaryDirectory::Init(TemporaryDirectory *this)

{
  ulong uVar1;
  char *pcVar2;
  string local_38 [8];
  string path;
  TemporaryDirectory *this_local;
  
  path.field_2._8_8_ = this;
  GetTempDir_abi_cxx11_();
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=(local_38,"bssl_tmp_dir.XXXXXX");
    pcVar2 = (char *)std::__cxx11::string::data();
    pcVar2 = mkdtemp(pcVar2);
    if (pcVar2 == (char *)0x0) {
      perror("Could not make temporary directory");
      this_local._7_1_ = false;
    }
    else {
      std::__cxx11::string::operator=((string *)this,local_38);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  std::__cxx11::string::~string(local_38);
  return this_local._7_1_;
}

Assistant:

bool TemporaryDirectory::Init() {
  std::string path = GetTempDir();
  if (path.empty()) {
    return false;
  }

#if defined(OPENSSL_WINDOWS)
  // For simplicity, just try the first candidate and assume the directory
  // doesn't exist. 128 bits of cryptographically secure randomness is plenty.
  uint8_t buf[16];
  RAND_bytes(buf, sizeof(buf));
  path += "bssl_tmp_dir." + EncodeHex(buf);
  if (!CreateDirectoryA(path.c_str(), /*lpSecurityAttributes=*/nullptr)) {
    perror("Could not make temporary directory");
    return false;
  }
#else
  path += "bssl_tmp_dir.XXXXXX";
  if (mkdtemp(path.data()) == nullptr) {
    perror("Could not make temporary directory");
    return false;
  }
#endif

  path_ = std::move(path);
  return true;
}